

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t set_mode(archive_write_disk *a,wchar_t mode)

{
  ulong uVar1;
  wchar_t wVar2;
  int iVar3;
  uint *puVar4;
  uint in_ESI;
  archive *in_RDI;
  wchar_t r;
  archive_write_disk *in_stack_ffffffffffffffc8;
  wchar_t local_18;
  uint local_14;
  
  local_18 = L'\0';
  local_14 = in_ESI & 0xfff;
  if (((ulong)in_RDI[3].sconv & 0x2000000) == 0) {
    if (((ulong)in_RDI[3].sconv & 0x8000000) != 0) {
      if ((in_RDI[1].archive_format_name != *(char **)&in_RDI[4].file_count) &&
         (local_14 = in_ESI & 0x7ff, (in_RDI[4].magic & 1) != 0)) {
        archive_set_error(in_RDI,-1,"Can\'t make file SUID");
        local_18 = L'\xffffffec';
      }
      *(uint *)&in_RDI[3].sconv = *(uint *)&in_RDI[3].sconv & 0xf7ffffff;
    }
  }
  else {
    wVar2 = lazy_stat(in_stack_ffffffffffffffc8);
    if (wVar2 != L'\0') {
      return wVar2;
    }
    local_18 = L'\0';
    if (((char *)(ulong)*(uint *)(in_RDI[3].error + 0x20) != in_RDI[4].error) &&
       (local_14 = in_ESI & 0xbff, (in_RDI[4].magic & 1) != 0)) {
      archive_set_error(in_RDI,-1,"Can\'t restore SGID bit");
      local_18 = L'\xffffffec';
    }
    uVar1._0_4_ = in_RDI[4].file_count;
    uVar1._4_4_ = in_RDI[4].archive_error_number;
    if (((*(uint *)(in_RDI[3].error + 0x1c) != uVar1) &&
        (((ulong)in_RDI[3].sconv & 0x10000000) != 0)) &&
       (local_14 = local_14 & 0xfffff7ff, (in_RDI[4].magic & 1) != 0)) {
      archive_set_error(in_RDI,-1,"Can\'t restore SUID bit");
      local_18 = L'\xffffffec';
    }
    *(uint *)&in_RDI[3].sconv = *(uint *)&in_RDI[3].sconv & 0xfdffffff;
    *(uint *)&in_RDI[3].sconv = *(uint *)&in_RDI[3].sconv & 0xf7ffffff;
  }
  if (((ulong)in_RDI[4].compression_name & 0xf00000000000) == 0xa00000000000) {
    iVar3 = lchmod((char *)in_RDI[3].error_string.length,local_14);
    if (iVar3 != 0) {
      puVar4 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar4,"Can\'t set permissions to 0%o",(ulong)local_14);
      local_18 = L'\xffffffec';
    }
  }
  else if (((ulong)in_RDI[4].compression_name & 0xf00000000000) != 0x400000000000) {
    if ((int)in_RDI[4].state < 0) {
      iVar3 = chmod((char *)in_RDI[3].error_string.length,local_14);
      if (iVar3 != 0) {
        puVar4 = (uint *)__errno_location();
        archive_set_error(in_RDI,(int)(ulong)*puVar4,"Can\'t set permissions to 0%o",(ulong)local_14
                         );
        local_18 = L'\xffffffec';
      }
    }
    else {
      iVar3 = fchmod(in_RDI[4].state,local_14);
      if (iVar3 != 0) {
        puVar4 = (uint *)__errno_location();
        archive_set_error(in_RDI,(int)(ulong)*puVar4,"Can\'t set permissions to 0%o",(ulong)local_14
                         );
        local_18 = L'\xffffffec';
      }
    }
  }
  return local_18;
}

Assistant:

static int
set_mode(struct archive_write_disk *a, int mode)
{
	int r = ARCHIVE_OK;
	mode &= 07777; /* Strip off file type bits. */

	if (a->todo & TODO_SGID_CHECK) {
		/*
		 * If we don't know the GID is right, we must stat()
		 * to verify it.  We can't just check the GID of this
		 * process, since systems sometimes set GID from
		 * the enclosing dir or based on ACLs.
		 */
		if ((r = lazy_stat(a)) != ARCHIVE_OK)
			return (r);
		if (a->pst->st_gid != a->gid) {
			mode &= ~ S_ISGID;
			if (a->flags & ARCHIVE_EXTRACT_OWNER) {
				/*
				 * This is only an error if you
				 * requested owner restore.  If you
				 * didn't, we'll try to restore
				 * sgid/suid, but won't consider it a
				 * problem if we can't.
				 */
				archive_set_error(&a->archive, -1,
				    "Can't restore SGID bit");
				r = ARCHIVE_WARN;
			}
		}
		/* While we're here, double-check the UID. */
		if (a->pst->st_uid != a->uid
		    && (a->todo & TODO_SUID)) {
			mode &= ~ S_ISUID;
			if (a->flags & ARCHIVE_EXTRACT_OWNER) {
				archive_set_error(&a->archive, -1,
				    "Can't restore SUID bit");
				r = ARCHIVE_WARN;
			}
		}
		a->todo &= ~TODO_SGID_CHECK;
		a->todo &= ~TODO_SUID_CHECK;
	} else if (a->todo & TODO_SUID_CHECK) {
		/*
		 * If we don't know the UID is right, we can just check
		 * the user, since all systems set the file UID from
		 * the process UID.
		 */
		if (a->user_uid != a->uid) {
			mode &= ~ S_ISUID;
			if (a->flags & ARCHIVE_EXTRACT_OWNER) {
				archive_set_error(&a->archive, -1,
				    "Can't make file SUID");
				r = ARCHIVE_WARN;
			}
		}
		a->todo &= ~TODO_SUID_CHECK;
	}

	if (S_ISLNK(a->mode)) {
#ifdef HAVE_LCHMOD
		/*
		 * If this is a symlink, use lchmod().  If the
		 * platform doesn't support lchmod(), just skip it.  A
		 * platform that doesn't provide a way to set
		 * permissions on symlinks probably ignores
		 * permissions on symlinks, so a failure here has no
		 * impact.
		 */
		if (lchmod(a->name, mode) != 0) {
			archive_set_error(&a->archive, errno,
			    "Can't set permissions to 0%o", (int)mode);
			r = ARCHIVE_WARN;
		}
#endif
	} else if (!S_ISDIR(a->mode)) {
		/*
		 * If it's not a symlink and not a dir, then use
		 * fchmod() or chmod(), depending on whether we have
		 * an fd.  Dirs get their perms set during the
		 * post-extract fixup, which is handled elsewhere.
		 */
#ifdef HAVE_FCHMOD
		if (a->fd >= 0) {
			if (fchmod(a->fd, mode) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't set permissions to 0%o", (int)mode);
				r = ARCHIVE_WARN;
			}
		} else
#endif
			/* If this platform lacks fchmod(), then
			 * we'll just use chmod(). */
			if (chmod(a->name, mode) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't set permissions to 0%o", (int)mode);
				r = ARCHIVE_WARN;
			}
	}
	return (r);
}